

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

double quaternion_difference_EXP(quaternion *q1,quaternion *q2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = (q2->field_0).q[0] - (q1->field_0).q[0];
  dVar3 = (q2->field_0).q[1] - (q1->field_0).q[1];
  dVar4 = (q2->field_0).q[2] - (q1->field_0).q[2];
  dVar1 = (q2->field_0).q[3] - (q1->field_0).q[3];
  return dVar1 * dVar1 + dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3;
}

Assistant:

HYPAPI HYP_FLOAT quaternion_difference_EXP(const struct quaternion *q1, const struct quaternion *q2)
{
	struct quaternion diff;

	diff.x = q2->x - q1->x;
	diff.y = q2->y - q1->y;
	diff.z = q2->z - q1->z;
	diff.w = q2->w - q1->w;
	return quaternion_norm(&diff);
}